

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O3

bool __thiscall google::protobuf::io::Tokenizer::TryConsumeWhitespace(Tokenizer *this)

{
  byte bVar1;
  undefined1 uVar2;
  
  bVar1 = this->current_char_;
  if (this->report_newlines_ == true) {
    uVar2 = 0;
    if ((bVar1 < 0x21) && (uVar2 = 0, (0x100003a00U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
      do {
        NextChar(this);
        if (0x20 < (ulong)(byte)this->current_char_) break;
      } while ((0x100003a00U >> ((ulong)(byte)this->current_char_ & 0x3f) & 1) != 0);
      (this->current_).type = TYPE_WHITESPACE;
      uVar2 = 1;
    }
  }
  else if ((bVar1 - 9 < 5) || (bVar1 == 0x20)) {
    do {
      do {
        NextChar(this);
      } while ((byte)this->current_char_ - 9 < 5);
    } while (this->current_char_ == 0x20);
    (this->current_).type = TYPE_WHITESPACE;
    uVar2 = this->report_whitespace_;
  }
  else {
    uVar2 = 0;
  }
  return (bool)uVar2;
}

Assistant:

bool Tokenizer::TryConsumeWhitespace() {
  if (report_newlines_) {
    if (TryConsumeOne<WhitespaceNoNewline>()) {
      ConsumeZeroOrMore<WhitespaceNoNewline>();
      current_.type = TYPE_WHITESPACE;
      return true;
    }
    return false;
  }
  if (TryConsumeOne<Whitespace>()) {
    ConsumeZeroOrMore<Whitespace>();
    current_.type = TYPE_WHITESPACE;
    return report_whitespace_;
  }
  return false;
}